

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::insertPthreadMutexLock(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  CallInst *in_RDI;
  LockNode *lockNode;
  LockNode *in_stack_00000040;
  GraphBuilder *in_stack_00000048;
  CallInst *in_stack_ffffffffffffffc8;
  LockNode *in_stack_ffffffffffffffd8;
  NodeSequence local_10;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)in_stack_ffffffffffffffd8);
  if (pFVar1 == (Function *)0x0) {
    createNode<(NodeType)3,decltype(nullptr),llvm::CallInst_const*>
              (in_RDI,in_stack_ffffffffffffffc8);
    addNode<LockNode>(in_stack_00000048,in_stack_00000040);
  }
  else {
    createNode<(NodeType)3,llvm::CallInst_const*>(in_RDI);
    addNode<LockNode>(in_stack_00000048,in_stack_00000040);
  }
  std::pair<Node_*,_Node_*>::pair<LockNode_*&,_LockNode_*&,_true>
            (&local_10,(LockNode **)&stack0xffffffffffffffd8,(LockNode **)&stack0xffffffffffffffd8);
  return local_10;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadMutexLock(const CallInst *callInstruction) {
    LockNode *lockNode;
    if (callInstruction->getCalledFunction()) {
        lockNode = addNode(createNode<NodeType::LOCK>(callInstruction));
    } else {
        lockNode =
                addNode(createNode<NodeType::LOCK>(nullptr, callInstruction));
    }

    return {lockNode, lockNode};
}